

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# residual_functions.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
IsobarImposedRho0VLEResiduals<double>::call
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          IsobarImposedRho0VLEResiduals<double> *this,
          vector<double,_std::allocator<double>_> *lnrhovec)

{
  pointer *ppdVar1;
  ulong uVar2;
  Index IVar3;
  bool bVar4;
  reference pvVar5;
  CoeffReturnType pdVar6;
  size_type sVar7;
  CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar8;
  double dVar9;
  double dVar10;
  allocator local_151;
  string local_150;
  ulong local_130;
  size_t i;
  double chempotr1V;
  double chempotr0V;
  double pV;
  double chempotr1L;
  double chempotr0L;
  double pL;
  double R;
  MixDerivs<double> *derV;
  MixDerivs<double> *derL;
  undefined1 local_d8 [16];
  Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_c8;
  undefined1 local_b0 [8];
  ArrayXd rhovecV;
  Map<const_Eigen::Array<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_98;
  undefined1 local_80 [8];
  ArrayXd rhovecL;
  size_type N;
  undefined1 local_58 [8];
  vector<double,_std::allocator<double>_> _rhovecV;
  vector<double,_std::allocator<double>_> _rhovecL;
  double T;
  vector<double,_std::allocator<double>_> *lnrhovec_local;
  IsobarImposedRho0VLEResiduals<double> *this_local;
  
  ppdVar1 = &_rhovecV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)ppdVar1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_58);
  unpack(this,lnrhovec,
         (double *)
         &_rhovecL.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,
         (vector<double,_std::allocator<double>_> *)ppdVar1,
         (vector<double,_std::allocator<double>_> *)local_58);
  ppdVar1 = &_rhovecV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  rhovecL.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       std::vector<double,_std::allocator<double>_>::size
                 ((vector<double,_std::allocator<double>_> *)ppdVar1);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)ppdVar1,0);
  IVar3 = rhovecL.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::Stride<0,_0>::Stride
            ((Stride<0,_0> *)
             ((long)&rhovecV.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage
                     .m_rows + 6));
  Eigen::Map<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (&local_98,pvVar5,IVar3,
             (Stride<0,_0> *)
             ((long)&rhovecV.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage
                     .m_rows + 6));
  Eigen::Array<double,-1,1,0,-1,1>::
  Array<Eigen::Map<Eigen::Array<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
            ((Array<double,_1,1,0,_1,1> *)local_80,&local_98);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_58,0);
  IVar3 = rhovecL.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::Stride<0,_0>::Stride((Stride<0,_0> *)(local_d8 + 0xe));
  Eigen::Map<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (&local_c8,pvVar5,IVar3,(Stride<0,_0> *)(local_d8 + 0xe));
  Eigen::Array<double,-1,1,0,-1,1>::
  Array<Eigen::Map<Eigen::Array<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
            ((Array<double,_1,1,0,_1,1> *)local_b0,&local_c8);
  std::
  function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_&)>
  ::operator()((function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_&)>
                *)local_d8,
               (double)_rhovecL.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
               (Array<double,__1,_1,_0,__1,_1> *)&this->m_factory);
  std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  operator=(&this->m_derL,
            (unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *)
            local_d8);
  std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  ~unique_ptr((unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *
              )local_d8);
  std::
  function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,_-1,_1,_0,_-1,_1>_&)>
  ::operator()((function<std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>_(double,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_&)>
                *)&derL,(double)_rhovecL.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage,
               (Array<double,__1,_1,_0,__1,_1> *)&this->m_factory);
  std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  operator=(&this->m_derV,
            (unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *)
            &derL);
  std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
  ~unique_ptr((unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_> *
              )&derL);
  derV = std::unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
         get(&this->m_derL);
  R = (double)std::
              unique_ptr<const_MixDerivs<double>,_std::default_delete<const_MixDerivs<double>_>_>::
              get(&this->m_derV);
  pL = derV->R;
  chempotr0L = MixDerivs<double>::p(derV);
  chempotr1L = MixDerivs<double>::dpsir_drhoi__constTrhoj(derV,0);
  pV = MixDerivs<double>::dpsir_drhoi__constTrhoj(derV,1);
  chempotr0V = MixDerivs<double>::p((MixDerivs<double> *)R);
  chempotr1V = MixDerivs<double>::dpsir_drhoi__constTrhoj((MixDerivs<double> *)R,0);
  i = (size_t)MixDerivs<double>::dpsir_drhoi__constTrhoj((MixDerivs<double> *)R,1);
  std::vector<double,_std::allocator<double>_>::resize(&this->y,5);
  dVar8 = chempotr1L - chempotr1V;
  dVar9 = pL * (double)_rhovecL.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)local_80,0);
  dVar10 = *pdVar6;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)local_b0,0);
  dVar10 = log(dVar10 / *pdVar6);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->y,0);
  *pvVar5 = dVar9 * dVar10 + dVar8;
  dVar8 = pV - (double)i;
  dVar9 = pL * (double)_rhovecL.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)local_80,1);
  dVar10 = *pdVar6;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)local_b0,1);
  dVar10 = log(dVar10 / *pdVar6);
  this_01 = &this->y;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_01,1);
  *pvVar5 = dVar9 * dVar10 + dVar8;
  dVar10 = chempotr0L - this->m_p;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_01,2);
  *pvVar5 = dVar10;
  dVar10 = chempotr0V - this->m_p;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_01,3);
  *pvVar5 = dVar10;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)local_80,
                      this->m_imposed_index);
  dVar10 = *pdVar6;
  dVar8 = this->m_rho0;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->y,4);
  *pvVar5 = dVar10 - dVar8;
  local_130 = 0;
  while( true ) {
    uVar2 = local_130;
    sVar7 = std::vector<double,_std::allocator<double>_>::size(&this->y);
    if (sVar7 <= uVar2) {
      std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,&this->y);
      Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array((Array<double,__1,_1,_0,__1,_1> *)local_b0);
      Eigen::Array<double,_-1,_1,_0,_-1,_1>::~Array((Array<double,__1,_1,_0,__1,_1> *)local_80);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_58);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 &_rhovecV.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&this->y,local_130);
    bVar4 = ValidNumber(*pvVar5);
    if (!bVar4) break;
    local_130 = local_130 + 1;
  }
  this_00 = (CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4> *)__cxa_allocate_exception(0x30)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"Invalid value found",&local_151);
  CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::CoolPropError
            (this_00,&local_150,eValue);
  __cxa_throw(this_00,&CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::typeinfo,
              CoolProp::CoolPropError<(CoolProp::CoolPropBaseError::ErrCode)4>::~CoolPropError);
}

Assistant:

std::vector<TYPE> call(const std::vector<TYPE> &lnrhovec) {
        TYPE T; std::vector<TYPE> _rhovecL, _rhovecV;
        unpack(lnrhovec, T, _rhovecL, _rhovecV);

        auto N = _rhovecL.size();
        const Eigen::ArrayXd rhovecL = Eigen::Map<const Eigen::ArrayXd>(&(_rhovecL[0]), N);
        const Eigen::ArrayXd rhovecV = Eigen::Map<const Eigen::ArrayXd>(&(_rhovecV[0]), N);

        m_derL = m_factory(T, rhovecL);
        m_derV = m_factory(T, rhovecV);
        auto &derL = *(m_derL.get()), &derV = *(m_derV.get()); TYPE R = derL.R;

        TYPE pL = derL.p(), chempotr0L = derL.dpsir_drhoi__constTrhoj(0), chempotr1L = derL.dpsir_drhoi__constTrhoj(1);
        TYPE pV = derV.p(), chempotr0V = derV.dpsir_drhoi__constTrhoj(0), chempotr1V = derV.dpsir_drhoi__constTrhoj(1);

        y.resize(5);
        y[0] = chempotr0L - chempotr0V + R*T*log(rhovecL[0] / rhovecV[0]);
        y[1] = chempotr1L - chempotr1V + R*T*log(rhovecL[1] / rhovecV[1]);
        y[2] = pL - m_p;
        y[3] = pV - m_p;
        y[4] = rhovecL[m_imposed_index] - m_rho0;
        for (std::size_t i = 0; i < y.size(); ++i) {
            if (!ValidNumber(y[i])) {
                throw ValueError("Invalid value found");
            }
        }
        return y;
    }